

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_pubsub_reattach(fio_pubsub_engine_s *eng)

{
  channel_s *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [24];
  undefined1 auVar7 [24];
  fio_ch_set__ordered_s_ *pfVar8;
  fio_lock_i ret;
  
  fio_lock(&fio_postoffice.pubsub.lock);
  for (pfVar8 = fio_postoffice.pubsub.channels.ordered;
      (pfVar8 != (fio_ch_set__ordered_s_ *)0x0 &&
      (pfVar8 < fio_postoffice.pubsub.channels.ordered + fio_postoffice.pubsub.channels.pos));
      pfVar8 = pfVar8 + 1) {
    if (pfVar8->hash != 0) {
      uVar2 = pfVar8->obj->name_len;
      uVar3 = pfVar8->obj->name;
      auVar6._8_8_ = uVar3;
      auVar6._0_8_ = uVar2;
      auVar6._16_8_ = 0;
      (*eng->subscribe)(eng,(fio_str_info_s)(auVar6 << 0x40),(fio_match_fn)0x0);
    }
  }
  LOCK();
  fio_postoffice.pubsub.lock = '\0';
  UNLOCK();
  fio_lock(&fio_postoffice.patterns.lock);
  for (pfVar8 = fio_postoffice.patterns.channels.ordered;
      (pfVar8 != (fio_ch_set__ordered_s_ *)0x0 &&
      (pfVar8 < fio_postoffice.patterns.channels.ordered + fio_postoffice.patterns.channels.pos));
      pfVar8 = pfVar8 + 1) {
    if (pfVar8->hash != 0) {
      pcVar1 = pfVar8->obj;
      uVar4 = pcVar1->name_len;
      uVar5 = pcVar1->name;
      auVar7._8_8_ = uVar5;
      auVar7._0_8_ = uVar4;
      auVar7._16_8_ = 0;
      (*eng->subscribe)(eng,(fio_str_info_s)(auVar7 << 0x40),pcVar1->match);
    }
  }
  LOCK();
  fio_postoffice.patterns.lock = '\0';
  UNLOCK();
  return;
}

Assistant:

void fio_pubsub_reattach(fio_pubsub_engine_s *eng) {
  fio_lock(&fio_postoffice.pubsub.lock);
  FIO_SET_FOR_LOOP(&fio_postoffice.pubsub.channels, pos) {
    if (!pos->hash)
      continue;
    eng->subscribe(
        eng,
        (fio_str_info_s){.data = pos->obj->name, .len = pos->obj->name_len},
        NULL);
  }
  fio_unlock(&fio_postoffice.pubsub.lock);
  fio_lock(&fio_postoffice.patterns.lock);
  FIO_SET_FOR_LOOP(&fio_postoffice.patterns.channels, pos) {
    if (!pos->hash)
      continue;
    eng->subscribe(
        eng,
        (fio_str_info_s){.data = pos->obj->name, .len = pos->obj->name_len},
        pos->obj->match);
  }
  fio_unlock(&fio_postoffice.patterns.lock);
}